

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

double wdm::utils::perm_sum(vector<double,_std::allocator<double>_> *x,size_t k)

{
  pointer pdVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<double,_std::allocator<double>_> res;
  allocator_type local_69;
  double local_68;
  double local_60;
  double local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (k == 0) {
    return 1.0;
  }
  uVar3 = 1;
  dVar6 = 0.0;
  do {
    lVar2 = uVar3 - 1;
    auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = 0x45300000;
    local_58 = dVar6;
    local_68 = pow(-1.0,(auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    local_60 = perm_sum(x,k - uVar3);
    local_50 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_48,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_50,&local_69);
    if (uVar3 != 0) {
      pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
      if (lVar2 != 0) {
        lVar2 = lVar2 >> 3;
        lVar4 = 0;
        do {
          dVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
          uVar5 = uVar3;
          do {
            dVar6 = dVar6 * pdVar1[lVar4];
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] = dVar6;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          lVar4 = lVar4 + 1;
        } while (lVar4 != lVar2 + (ulong)(lVar2 == 0));
      }
    }
    if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      dVar6 = local_68 * local_60 * 0.0 + local_58;
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_00106a7d;
    }
    else {
      lVar2 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      dVar6 = 0.0;
      lVar4 = 0;
      do {
        dVar6 = dVar6 + local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
      dVar6 = local_68 * local_60 * dVar6 + local_58;
LAB_00106a7d:
      local_68 = dVar6;
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      dVar6 = local_68;
    }
    uVar3 = uVar3 + 1;
    if (k < uVar3) {
      auVar8._8_4_ = (int)(k >> 0x20);
      auVar8._0_8_ = k;
      auVar8._12_4_ = 0x45300000;
      return dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    }
  } while( true );
}

Assistant:

inline double perm_sum(const std::vector<double>& x, size_t k)
{
    if (k == 0)
        return 1.0;
    double s = 0;
    for (size_t i = 1; i <= k; i++)
        s += std::pow(-1.0, i - 1) * perm_sum(x, k - i) * sum(pow(x, i));
    return s / k;
}